

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall DPhased::Tick(DPhased *this)

{
  byte bVar1;
  uint uVar2;
  BYTE BVar3;
  sector_t_conflict *psVar4;
  
  bVar1 = this->m_Phase;
  if (bVar1 < 0xc) {
    psVar4 = (this->super_DLighting).super_DSectorEffect.m_Sector;
    uVar2 = ((uint)(byte)~this->m_BaseLevel * (uint)bVar1) / 0xc + (uint)this->m_BaseLevel;
  }
  else {
    psVar4 = (this->super_DLighting).super_DSectorEffect.m_Sector;
    uVar2 = (uint)this->m_BaseLevel;
    if ((bVar1 < 0x18) &&
       (uVar2 = ((0x17 - (uint)bVar1) * (uVar2 ^ 0xff)) / 0xc + uVar2, 0x7ffe < uVar2)) {
      uVar2 = 0x7fff;
    }
  }
  psVar4->lightlevel = (short)uVar2;
  BVar3 = '?';
  if (bVar1 != 0) {
    BVar3 = bVar1 - 1;
  }
  this->m_Phase = BVar3;
  return;
}

Assistant:

void DPhased::Tick ()
{
	const int steps = 12;

	if (m_Phase < steps)
		m_Sector->SetLightLevel( ((255 - m_BaseLevel) * m_Phase) / steps + m_BaseLevel);
	else if (m_Phase < 2*steps)
		m_Sector->SetLightLevel( ((255 - m_BaseLevel) * (2*steps - m_Phase - 1) / steps
								+ m_BaseLevel));
	else
		m_Sector->SetLightLevel(m_BaseLevel);

	if (m_Phase == 0)
		m_Phase = 63;
	else
		m_Phase--;
}